

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  LogMessage *pLVar8;
  ostream *poVar9;
  string parameters_1;
  string parameters;
  string error;
  LogFinisher local_c9;
  string local_c8;
  undefined1 local_a8 [56];
  string local_70;
  long *local_50;
  string *local_48;
  long local_40 [2];
  
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (output_directive->generator == (CodeGenerator *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--","");
    if (((string *)(output_directive->name)._M_string_length < local_c8._M_string_length) ||
       (iVar6 = std::__cxx11::string::compare
                          ((ulong)output_directive,0,(string *)local_c8._M_string_length),
       iVar6 != 0)) {
      bVar5 = false;
LAB_00205367:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x5ff);
      pLVar8 = internal::LogMessage::operator<<
                         ((LogMessage *)local_a8,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar8 = internal::LogMessage::operator<<(pLVar8,"Bad name for plugin generator: ");
      pLVar8 = internal::LogMessage::operator<<(pLVar8,&output_directive->name);
      internal::LogFinisher::operator=(&local_c9,pLVar8);
      internal::LogMessage::~LogMessage((LogMessage *)local_a8);
      if (bVar5) goto LAB_002053c9;
    }
    else {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_out","");
      psVar4 = (string *)(output_directive->name)._M_string_length;
      bVar5 = true;
      if ((psVar4 < local_48) ||
         (iVar6 = std::__cxx11::string::compare
                            ((ulong)output_directive,(long)psVar4 - (long)local_48,local_48),
         iVar6 != 0)) goto LAB_00205367;
LAB_002053c9:
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_0::PluginName
              ((string *)local_a8,(anon_unknown_0 *)(this->plugin_prefix_)._M_dataplus._M_p,
               (string *)(this->plugin_prefix_)._M_string_length,&output_directive->name);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar3 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,pcVar3 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,(key_type *)local_a8);
    if (pmVar7->_M_string_length != 0) {
      if ((string *)local_c8._M_string_length != (string *)0x0) {
        std::__cxx11::string::append((char *)&local_c8);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->plugin_parameters_,(key_type *)local_a8);
      std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    bVar5 = GeneratePluginOutput
                      (this,parsed_files,(string *)local_a8,&local_c8,generator_context,&local_70);
    if (!bVar5) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) goto LAB_0020555b;
      goto LAB_00205568;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) goto LAB_0020530d;
  }
  else {
    pcVar3 = local_a8 + 0x10;
    pcVar2 = (output_directive->parameter)._M_dataplus._M_p;
    local_a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar2,pcVar2 + (output_directive->parameter)._M_string_length);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar7->_M_string_length != 0) {
      if ((char *)local_a8._8_8_ != (char *)0x0) {
        std::__cxx11::string::append(local_a8);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append(local_a8,(ulong)(pmVar7->_M_dataplus)._M_p);
    }
    iVar6 = (*output_directive->generator->_vptr_CodeGenerator[3])
                      (output_directive->generator,parsed_files,local_a8,generator_context,&local_70
                      );
    if ((char)iVar6 == '\0') {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if ((pointer)local_a8._0_8_ != pcVar3) {
LAB_0020555b:
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
LAB_00205568:
      bVar5 = false;
      goto LAB_0020556a;
    }
    if ((pointer)local_a8._0_8_ != pcVar3) {
LAB_0020530d:
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
  }
  bVar5 = true;
LAB_0020556a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    string plugin_name = PluginName(plugin_prefix_ , output_directive.name);
    string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name,
                              parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!output_directive.generator->GenerateAll(
        parsed_files, parameters, generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}